

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testInit
          (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *this)

{
  GLuint GVar1;
  vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
  *this_00;
  GLuint index;
  GLuint j;
  GLuint index_00;
  bool *pbVar2;
  Type TVar3;
  Type TVar4;
  value_type local_2b0;
  value_type local_270;
  value_type local_230;
  value_type local_1f0;
  value_type local_1b0;
  value_type local_170;
  value_type local_130;
  value_type local_f0;
  value_type local_b0;
  value_type local_70;
  
  this_00 = &this->m_test_cases;
  for (index = 0; index != 0x22; index = index + 1) {
    TVar3 = TestBase::getType((TestBase *)this,index);
    GVar1 = TVar3.m_n_rows;
    if ((TVar3._0_8_ & 0xffffffff00000000) == 0x100000000) {
      pbVar2 = (bool *)0x1661930;
      if (TVar3.m_basic_type == Float) {
        pbVar2 = glcts::fixed_sample_locations_values + 1;
      }
      for (index_00 = 0; index_00 != 0x22; index_00 = index_00 + 1) {
        TVar4 = TestBase::getType((TestBase *)this,index_00);
        this = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)0x100000000;
        if ((((TVar4._0_8_ & 0xffffffff00000000) == 0x100000000) &&
            (TVar3.m_basic_type < Int == TVar4.m_basic_type < Int)) && (TVar4.m_n_rows + GVar1 < 5))
        {
          local_2b0.m_int_goten = "flat";
          if (TVar4.m_basic_type == Float) {
            local_2b0.m_int_goten = glcts::fixed_sample_locations_values + 1;
          }
          local_170.m_component_gohan = 0;
          local_170.m_aux_gohan = NONE;
          local_170.m_aux_goten = CENTROID;
          local_1b0.m_component_gohan = 0;
          local_1b0.m_aux_gohan = CENTROID;
          local_1b0.m_aux_goten = NONE;
          local_1f0.m_component_gohan = 0;
          local_1f0.m_aux_gohan = NONE;
          local_1f0.m_aux_goten = SAMPLE;
          local_230.m_component_gohan = 0;
          local_230.m_aux_gohan = SAMPLE;
          local_230.m_aux_goten = NONE;
          local_270.m_component_gohan = 0;
          local_270.m_aux_gohan = CENTROID;
          local_270.m_aux_goten = SAMPLE;
          local_2b0.m_component_gohan = 0;
          local_2b0.m_aux_gohan = SAMPLE;
          local_2b0.m_aux_goten = CENTROID;
          local_70.m_component_gohan = 0;
          local_70.m_aux_gohan = NONE;
          local_70.m_aux_goten = PATCH;
          local_70.m_int_gohan = glcts::fixed_sample_locations_values + 1;
          local_70.m_int_goten = glcts::fixed_sample_locations_values + 1;
          local_70.m_is_input = false;
          local_b0.m_stage = TESS_CTRL;
          local_b0.m_component_gohan = 0;
          local_b0.m_aux_gohan = PATCH;
          local_b0.m_aux_goten = NONE;
          local_b0.m_int_gohan = glcts::fixed_sample_locations_values + 1;
          local_b0.m_int_goten = glcts::fixed_sample_locations_values + 1;
          local_b0.m_is_input = false;
          local_f0.m_component_gohan = 0;
          local_f0.m_aux_gohan = NONE;
          local_f0.m_aux_goten = PATCH;
          local_f0.m_int_gohan = glcts::fixed_sample_locations_values + 1;
          local_f0.m_int_goten = glcts::fixed_sample_locations_values + 1;
          local_f0.m_is_input = true;
          local_130.m_stage = TESS_EVAL;
          local_130.m_component_gohan = 0;
          local_130.m_aux_gohan = PATCH;
          local_130.m_aux_goten = NONE;
          local_130.m_int_gohan = glcts::fixed_sample_locations_values + 1;
          local_130.m_int_goten = glcts::fixed_sample_locations_values + 1;
          local_130.m_is_input = true;
          local_170.m_is_input = true;
          local_2b0.m_stage = FRAGMENT;
          local_1b0.m_is_input = true;
          local_1f0.m_is_input = true;
          local_230.m_is_input = true;
          local_270.m_is_input = true;
          local_2b0.m_is_input = true;
          local_2b0.m_component_goten = GVar1;
          local_2b0.m_int_gohan = pbVar2;
          local_2b0.m_type_gohan = TVar3;
          local_270.m_component_goten = GVar1;
          local_270.m_int_gohan = pbVar2;
          local_270.m_int_goten = local_2b0.m_int_goten;
          local_270.m_stage = local_2b0.m_stage;
          local_270.m_type_gohan = TVar3;
          local_230.m_component_goten = GVar1;
          local_230.m_int_gohan = pbVar2;
          local_230.m_int_goten = local_2b0.m_int_goten;
          local_230.m_stage = local_2b0.m_stage;
          local_230.m_type_gohan = TVar3;
          local_1f0.m_component_goten = GVar1;
          local_1f0.m_int_gohan = pbVar2;
          local_1f0.m_int_goten = local_2b0.m_int_goten;
          local_1f0.m_stage = local_2b0.m_stage;
          local_1f0.m_type_gohan = TVar3;
          local_1b0.m_component_goten = GVar1;
          local_1b0.m_int_gohan = pbVar2;
          local_1b0.m_int_goten = local_2b0.m_int_goten;
          local_1b0.m_stage = local_2b0.m_stage;
          local_1b0.m_type_gohan = TVar3;
          local_170.m_component_goten = GVar1;
          local_170.m_int_gohan = pbVar2;
          local_170.m_int_goten = local_2b0.m_int_goten;
          local_170.m_stage = local_2b0.m_stage;
          local_170.m_type_gohan = TVar3;
          local_130.m_component_goten = GVar1;
          local_130.m_type_gohan = TVar3;
          local_f0.m_component_goten = GVar1;
          local_f0.m_stage = local_130.m_stage;
          local_f0.m_type_gohan = TVar3;
          local_b0.m_component_goten = GVar1;
          local_b0.m_type_gohan = TVar3;
          local_70.m_component_goten = GVar1;
          local_70.m_stage = local_b0.m_stage;
          local_70.m_type_gohan = TVar3;
          local_70.m_type_goten = TVar4;
          local_2b0.m_type_goten = TVar4;
          local_270.m_type_goten = TVar4;
          local_230.m_type_goten = TVar4;
          local_1f0.m_type_goten = TVar4;
          local_1b0.m_type_goten = TVar4;
          local_170.m_type_goten = TVar4;
          local_130.m_type_goten = TVar4;
          local_f0.m_type_goten = TVar4;
          local_b0.m_type_goten = TVar4;
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_70);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_b0);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_f0);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_130);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_170);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_1b0);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_1f0);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_230);
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_270);
          this = (VaryingLocationAliasingWithMixedAuxiliaryStorageTest *)this_00;
          std::
          vector<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testCase>_>
          ::push_back(this_00,&local_2b0);
        }
      }
    }
  }
  return;
}

Assistant:

void VaryingLocationAliasingWithMixedAuxiliaryStorageTest::testInit()
{
	static const GLuint n_components_per_location = 4;
	const GLuint		n_types					  = getTypesNumber();

	for (GLuint i = 0; i < n_types; ++i)
	{
		const Utils::Type& type_gohan		   = getType(i);
		const bool		   is_float_type_gohan = isFloatType(type_gohan);

		/* Skip matrices */
		if (1 != type_gohan.m_n_columns)
		{
			continue;
		}

		for (GLuint j = 0; j < n_types; ++j)
		{
			const Utils::Type& type_goten		   = getType(j);
			const bool		   is_flat_req_gohan   = (Utils::Type::Float == type_gohan.m_basic_type) ? false : true;
			const bool		   is_flat_req_goten   = (Utils::Type::Float == type_goten.m_basic_type) ? false : true;
			const bool		   is_float_type_goten = isFloatType(type_goten);

			/* Skip matrices */
			if (1 != type_goten.m_n_columns)
			{
				continue;
			}

			/* Skip invalid combinations */
			if (is_float_type_gohan != is_float_type_goten)
			{
				continue;
			}

			const GLuint n_req_components_gohan = type_gohan.m_n_rows;
			const GLuint n_req_components_goten = type_goten.m_n_rows;

			/* Skip pairs that cannot fit into one location */
			if (n_components_per_location < (n_req_components_gohan + n_req_components_goten))
			{
				continue;
			}

			const GLuint gohan = 0;
			const GLuint goten = gohan + n_req_components_gohan;

			const GLchar* fs_int_gohan = is_flat_req_gohan ? "flat" : "";
			const GLchar* fs_int_goten = is_flat_req_goten ? "flat" : "";

			testCase test_case_tcs_np = { gohan,	  goten,	 NONE, PATCH, "", "", false, Utils::Shader::TESS_CTRL,
										  type_gohan, type_goten };

			testCase test_case_tcs_pn = { gohan,	  goten,	 PATCH, NONE, "", "", false, Utils::Shader::TESS_CTRL,
										  type_gohan, type_goten };

			testCase test_case_tes_np = { gohan,	  goten,	 NONE, PATCH, "", "", true, Utils::Shader::TESS_EVAL,
										  type_gohan, type_goten };

			testCase test_case_tes_pn = { gohan,	  goten,	 PATCH, NONE, "", "", true, Utils::Shader::TESS_EVAL,
										  type_gohan, type_goten };

			testCase test_case_fs_nc = { gohan,		   goten,		 NONE, CENTROID,
										 fs_int_gohan, fs_int_goten, true, Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_cn = { gohan,		   goten,		 CENTROID, NONE,
										 fs_int_gohan, fs_int_goten, true,	 Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_ns = { gohan,		   goten,		 NONE, SAMPLE,
										 fs_int_gohan, fs_int_goten, true, Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_sn = { gohan,		   goten,		 SAMPLE, NONE,
										 fs_int_gohan, fs_int_goten, true,   Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_cs = { gohan,		   goten,		 CENTROID, SAMPLE,
										 fs_int_gohan, fs_int_goten, true,	 Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			testCase test_case_fs_sc = { gohan,		   goten,		 SAMPLE, CENTROID,
										 fs_int_gohan, fs_int_goten, true,   Utils::Shader::FRAGMENT,
										 type_gohan,   type_goten };

			m_test_cases.push_back(test_case_tcs_np);
			m_test_cases.push_back(test_case_tcs_pn);
			m_test_cases.push_back(test_case_tes_np);
			m_test_cases.push_back(test_case_tes_pn);
			m_test_cases.push_back(test_case_fs_nc);
			m_test_cases.push_back(test_case_fs_cn);
			m_test_cases.push_back(test_case_fs_ns);
			m_test_cases.push_back(test_case_fs_sn);
			m_test_cases.push_back(test_case_fs_cs);
			m_test_cases.push_back(test_case_fs_sc);
		}
	}
}